

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.h
# Opt level: O1

void __thiscall DataRefs::ChTsOffsetAdd(DataRefs *this,double aNetTS)

{
  int iVar1;
  int iVar2;
  difference_type __n;
  long lVar3;
  
  if (this->cntAc != 0) {
    return;
  }
  lVar3 = -0x34;
  iVar2 = 0;
  do {
    iVar2 = iVar2 + (uint)(*(int *)((long)this->bChannel + lVar3 + 0x34) == 1);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  if (SBORROW4(this->chTsOffsetCnt,iVar2 * 2) != this->chTsOffsetCnt + iVar2 * -2 < 0) {
    lVar3 = std::chrono::_V2::system_clock::now();
    iVar2 = this->chTsOffsetCnt;
    iVar1 = iVar2 + 1;
    this->chTsOffsetCnt = iVar1;
    this->chTsOffset =
         ((double)iVar2 * this->chTsOffset + aNetTS + (double)(lVar3 / 1000) / -1000000.0) /
         (double)iVar1;
  }
  return;
}

Assistant:

bool ChTsAcceptMore () const { return cntAc == 0 && chTsOffsetCnt < CntChannelEnabled() * 2; }